

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

el_action_t ed_move_to_beg(EditLine *el,wint_t c)

{
  int iVar1;
  wchar_t *pwVar2;
  el_action_t eVar3;
  
  pwVar2 = (el->el_line).buffer;
  (el->el_line).cursor = pwVar2;
  eVar3 = '\x05';
  if ((el->el_map).type == L'\x01') {
    while (iVar1 = iswspace(*pwVar2), iVar1 != 0) {
      pwVar2 = (el->el_line).cursor + 1;
      (el->el_line).cursor = pwVar2;
    }
    if ((el->el_chared).c_vcmd.action != L'\0') {
      cv_delfini(el);
      eVar3 = '\x04';
    }
  }
  return eVar3;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_move_to_beg(EditLine *el, wint_t c __attribute__((__unused__)))
{

	el->el_line.cursor = el->el_line.buffer;

	if (el->el_map.type == MAP_VI) {
			/* We want FIRST non space character */
		while (iswspace(*el->el_line.cursor))
			el->el_line.cursor++;
		if (el->el_chared.c_vcmd.action != NOP) {
			cv_delfini(el);
			return CC_REFRESH;
		}
	}
	return CC_CURSOR;
}